

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserDefinedMeasurementCollector.cpp
# Opt level: O2

void __thiscall
celero::UserDefinedMeasurementCollector::collect
          (UserDefinedMeasurementCollector *this,shared_ptr<celero::TestFixture> *fixture)

{
  element_type *peVar1;
  mapped_type *pmVar2;
  __shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<celero::UserDefinedMeasurement> udm;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  udms;
  __shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2> local_78;
  key_type local_68;
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  local_48;
  
  (*((fixture->super___shared_ptr<celero::TestFixture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    _vptr_TestFixture[9])(&local_48);
  if (local_48.
      super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (p_Var3 = &(local_48.
                    super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>;
        p_Var3 != &(local_48.
                    super__Vector_base<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                   super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>;
        p_Var3 = p_Var3 + 1) {
      std::__shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,p_Var3);
      (**(code **)(*(long *)local_78._M_ptr + 0x18))(&local_68);
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,&local_68);
      peVar1 = (pmVar2->
               super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      std::__cxx11::string::~string((string *)&local_68);
      if (peVar1 == (element_type *)0x0) {
        (**(code **)(*(long *)local_78._M_ptr + 0x18))(&local_68);
        this_00 = &std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,&local_68)->
                   super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_00,&local_78);
      }
      else {
        (**(code **)(*(long *)local_78._M_ptr + 0x18))(&local_68);
        pmVar2 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<celero::UserDefinedMeasurement>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&local_68);
        peVar1 = (pmVar2->
                 super___shared_ptr<celero::UserDefinedMeasurement,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        (**(code **)(*(long *)peVar1 + 0x20))(peVar1,local_78._M_ptr);
      }
      std::__cxx11::string::~string((string *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    }
  }
  std::
  vector<std::shared_ptr<celero::UserDefinedMeasurement>,_std::allocator<std::shared_ptr<celero::UserDefinedMeasurement>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void UserDefinedMeasurementCollector::collect(std::shared_ptr<TestFixture> fixture)
{
	const auto udms = fixture->getUserDefinedMeasurements();

	if(udms.empty() == false)
	{
		for(auto udm : udms)
		{
			if(this->collected[udm->getName()] == nullptr)
			{
				this->collected[udm->getName()] = udm;
			}
			else
			{
				this->collected[udm->getName()]->merge(&*udm);
			}
		}
	}
}